

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O2

_Bool upb_MiniTable_SetSubMessage(upb_MiniTable *table,upb_MiniTableField *field,upb_MiniTable *sub)

{
  uint __line;
  char *__assertion;
  
  if ((field < table->fields_dont_copy_me__upb_internal_use_only) ||
     (table->fields_dont_copy_me__upb_internal_use_only +
      table->field_count_dont_copy_me__upb_internal_use_only <= field)) {
    __assertion = 
    "(uintptr_t)table->fields_dont_copy_me__upb_internal_use_only <= (uintptr_t)field && (uintptr_t)field < (uintptr_t)(table->fields_dont_copy_me__upb_internal_use_only + table->field_count_dont_copy_me__upb_internal_use_only)"
    ;
    __line = 0x1f;
  }
  else {
    if (sub != (upb_MiniTable *)0x0) {
      if (field->descriptortype_dont_copy_me__upb_internal_use_only == '\n') {
        if ((sub->ext_dont_copy_me__upb_internal_use_only & 4) == 0) goto LAB_002557e8;
      }
      else if (field->descriptortype_dont_copy_me__upb_internal_use_only == '\v') {
        if ((sub->ext_dont_copy_me__upb_internal_use_only & 4) != 0) {
          if ((table->ext_dont_copy_me__upb_internal_use_only & 4) != 0) {
            return false;
          }
          field->mode_dont_copy_me__upb_internal_use_only =
               field->mode_dont_copy_me__upb_internal_use_only & 0xfc;
        }
LAB_002557e8:
        *table->subs_dont_copy_me__upb_internal_use_only
         [field->submsg_index_dont_copy_me__upb_internal_use_only].
         submsg_dont_copy_me__upb_internal_use_only = sub;
        return true;
      }
      return false;
    }
    __assertion = "sub";
    __line = 0x20;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_descriptor/link.c"
                ,__line,
                "_Bool upb_MiniTable_SetSubMessage(upb_MiniTable *, upb_MiniTableField *, const upb_MiniTable *)"
               );
}

Assistant:

bool upb_MiniTable_SetSubMessage(upb_MiniTable* table,
                                 upb_MiniTableField* field,
                                 const upb_MiniTable* sub) {
  UPB_ASSERT((uintptr_t)table->UPB_PRIVATE(fields) <= (uintptr_t)field &&
             (uintptr_t)field < (uintptr_t)(table->UPB_PRIVATE(fields) +
                                            table->UPB_PRIVATE(field_count)));
  UPB_ASSERT(sub);

  const bool sub_is_map = sub->UPB_PRIVATE(ext) & kUpb_ExtMode_IsMapEntry;

  switch (field->UPB_PRIVATE(descriptortype)) {
    case kUpb_FieldType_Message:
      if (sub_is_map) {
        const bool table_is_map =
            table->UPB_PRIVATE(ext) & kUpb_ExtMode_IsMapEntry;
        if (UPB_UNLIKELY(table_is_map)) return false;

        field->UPB_PRIVATE(mode) =
            (field->UPB_PRIVATE(mode) & ~kUpb_FieldMode_Mask) |
            kUpb_FieldMode_Map;
      }
      break;

    case kUpb_FieldType_Group:
      if (UPB_UNLIKELY(sub_is_map)) return false;
      break;

    default:
      return false;
  }

  int idx = field->UPB_PRIVATE(submsg_index);
  upb_MiniTableSubInternal* table_subs = (void*)table->UPB_PRIVATE(subs);
  // TODO: Add this assert back once YouTube is updated to not call
  // this function repeatedly.
  // UPB_ASSERT(UPB_PRIVATE(_upb_MiniTable_IsEmpty)(table_sub->submsg));
  memcpy((void*)table_subs[idx].UPB_PRIVATE(submsg), &sub, sizeof(void*));
  return true;
}